

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-attack.c
# Opt level: O1

void py_attack(player *p,loc grid)

{
  wchar_t *pwVar1;
  bitflag *flags;
  ushort uVar2;
  short sVar3;
  uint uVar4;
  _Bool _Var5;
  int16_t iVar6;
  wchar_t wVar7;
  uint32_t uVar8;
  int iVar9;
  monster_conflict *pmVar10;
  monster_conflict *pmVar11;
  object *poVar12;
  sbyte sVar13;
  int iVar14;
  short sVar15;
  int iVar16;
  wchar_t wVar17;
  uint sp_gain;
  wchar_t dam;
  int iVar18;
  _Bool fear;
  _Bool local_49;
  object *local_48;
  long local_40;
  monster_conflict *local_38;
  
  uVar2 = z_info->move_energy;
  uVar4 = (int)p->energy;
  if ((int)(uint)uVar2 <= (int)p->energy) {
    uVar4 = (uint)uVar2;
  }
  wVar17 = (p->state).num_blows;
  local_49 = false;
  pmVar10 = (monster_conflict *)square_monster(cave,grid);
  disturb(p);
  p->upkeep->energy_use = L'\0';
  flags = (p->state).pflags;
  _Var5 = flag_has_dbg(flags,3,0x11,"p->state.pflags","(PF_COMBAT_REGEN)");
  if (_Var5) {
    sp_gain = 0x8000;
    if (9 < p->msp) {
      sp_gain = (uint)((ulong)(uint)((int)p->msp << 0xe) * 0x66666667 >> 0x21);
    }
    player_adjust_mana_precise(p,sp_gain);
  }
  _Var5 = flag_has_dbg(flags,3,0xf,"p->state.pflags","(PF_SHIELD_BASH)");
  if ((_Var5) && (_Var5 = monster_is_visible((monster *)pmVar10), _Var5)) {
    wVar7 = slot_by_name(p,"weapon");
    pmVar11 = (monster_conflict *)slot_object(p,wVar7);
    wVar7 = slot_by_name(p,"arm");
    poVar12 = slot_object(p,wVar7);
    iVar9 = (p->state).skills[6];
    iVar18 = iVar9 + 7;
    if (-1 < iVar9) {
      iVar18 = iVar9;
    }
    if ((poVar12 != (object *)0x0) &&
       ((int)(short)(p->lev - (p->lev >> 0xf)) >> 1 <= pmVar10->race->level)) {
      local_40 = (long)(p->state).num_blows;
      iVar9 = adj_dex_th[(p->state).stat_ind[3]];
      local_48 = poVar12;
      local_38 = pmVar11;
      poVar12 = equipped_item_by_slot_name(p,"weapon");
      if (poVar12 == (object *)0x0) {
        sVar13 = 2;
      }
      else {
        iVar14 = (int)((ulong)(local_40 * 0x51eb851f) >> 0x20);
        iVar16 = (uint)*(uint8_t *)((long)&local_38->mimicked_obj + 3) *
                 (uint)*(uint8_t *)((long)&local_38->mimicked_obj + 2) *
                 ((iVar14 >> 5) - (iVar14 >> 0x1f));
        iVar14 = (uint)local_48->ds * (uint)local_48->dd;
        sVar13 = SBORROW4(iVar16,iVar14 * 3) != iVar16 + iVar14 * -3 < 0;
      }
      uVar8 = Rand_div(pmVar10->race->level + L'È');
      if ((int)uVar8 < iVar9 / 2 + (iVar18 >> 3) << sVar13) {
        iVar9 = (p->state).skills[6];
        iVar18 = iVar9 + 3;
        if (-1 < iVar9) {
          iVar18 = iVar9;
        }
        sVar3 = p->wt;
        sVar15 = sVar3 + 7;
        if (-1 < sVar3) {
          sVar15 = sVar3;
        }
        local_40 = CONCAT44(local_40._4_4_,((int)sVar15 >> 3) + (iVar18 >> 2));
        wVar7 = p->upkeep->total_weight;
        iVar6 = object_weight_one(local_48);
        iVar18 = ((int)(short)(iVar6 - (iVar6 >> 0xf)) >> 1) + (int)local_40 + wVar7 / 0x50;
        local_38 = pmVar10;
        iVar9 = damroll((uint)local_48->dd,(uint)local_48->ds);
        pmVar10 = local_38;
        local_48 = (object *)CONCAT44(local_48._4_4_,iVar18);
        iVar9 = ((int)p->lev / 0xe + iVar18 / 0x28) * iVar9;
        wVar7 = iVar9 + adj_str_td[(p->state).stat_ind[0]];
        if (wVar7 != L'\0' && SCARRY4(iVar9,adj_str_td[(p->state).stat_ind[0]]) == wVar7 < L'\0') {
          dam = L'}';
          if (wVar7 < L'}') {
            dam = wVar7;
          }
          if ((p->opts).opt[3] == true) {
            msgt(2,"You get in a shield bash! (%d)",(ulong)(uint)dam);
          }
          else {
            msgt(2,"You get in a shield bash!");
          }
          uVar8 = Rand_div(dam);
          local_40 = CONCAT44(local_40._4_4_,uVar8);
          uVar8 = Rand_div((uint)dam >> 1);
          if ((int)(uVar8 + 0x1f) <= (int)local_40) {
            msgt(0x91,"WHAMM!");
          }
          _Var5 = mon_take_hit(pmVar10,p,dam,&local_49,(char *)0x0);
          if (_Var5) {
            return;
          }
          iVar9 = p->lev + (int)local_48;
          uVar8 = Rand_div(pmVar10->race->level * 8 + 200);
          if ((int)(uVar8 + 1) < iVar9) {
            uVar8 = Rand_div((int)p->lev / 5);
            mon_inc_timed((monster *)pmVar10,L'\x01',uVar8 + L'\x04',L'\0');
          }
          iVar9 = (int)local_48 + p->lev;
          uVar8 = Rand_div(local_38->race->level * 0xc + 300);
          pmVar10 = local_38;
          if ((int)(uVar8 + 1) < iVar9) {
            uVar8 = Rand_div((int)p->lev / 5);
            mon_inc_timed((monster *)pmVar10,L'\x02',uVar8 + L'\x04',L'\0');
          }
          iVar9 = adj_dex_th[(p->state).stat_ind[3]];
          uVar8 = Rand_div(0x3c);
          if (iVar9 + 0x23 <= (int)uVar8) {
            uVar8 = Rand_div(0x32);
            msgt(0,"You stumble!");
            pwVar1 = &p->upkeep->energy_use;
            *pwVar1 = *pwVar1 + (int)((uint)z_info->move_energy * (uVar8 + 0x1a)) / 100;
          }
        }
      }
    }
  }
  iVar9 = (int)((long)(ulong)((uint)uVar2 * 100) / (long)wVar17);
  if (iVar9 <= uVar4 - p->upkeep->energy_use) {
    do {
      _Var5 = py_attack_real(p,grid,&local_49);
      wVar17 = p->upkeep->energy_use + iVar9;
      p->upkeep->energy_use = wVar17;
      if (uVar4 - wVar17 < iVar9) break;
    } while (!_Var5);
  }
  if ((local_49 == true) && (_Var5 = monster_is_visible((monster *)pmVar10), _Var5)) {
    add_monster_message(pmVar10,L'#',true);
  }
  return;
}

Assistant:

void py_attack(struct player *p, struct loc grid)
{
	int avail_energy = MIN(p->energy, z_info->move_energy);
	int blow_energy = 100 * z_info->move_energy / p->state.num_blows;
	bool slain = false, fear = false;
	struct monster *mon = square_monster(cave, grid);

	/* Disturb the player */
	disturb(p);

	/* Initialize the energy used */
	p->upkeep->energy_use = 0;

	/* Reward BGs with 5% of max SPs, min 1/2 point */
	if (player_has(p, PF_COMBAT_REGEN)) {
		int32_t sp_gain = (((int32_t)MAX(p->msp, 10)) * 16384) / 5;
		player_adjust_mana_precise(p, sp_gain);
	}

	/* Player attempts a shield bash if they can, and if monster is visible
	 * and not too pathetic */
	if (player_has(p, PF_SHIELD_BASH) && monster_is_visible(mon)) {
		/* Monster may die */
		if (attempt_shield_bash(p, mon, &fear)) return;
	}

	/* Attack until the next attack would exceed energy available or
	 * a full turn or until the enemy dies. We limit energy use
	 * to avoid giving monsters a possible double move. */
	while (avail_energy - p->upkeep->energy_use >= blow_energy && !slain) {
		slain = py_attack_real(p, grid, &fear);
		p->upkeep->energy_use += blow_energy;
	}

	/* Hack - delay fear messages */
	if (fear && monster_is_visible(mon)) {
		add_monster_message(mon, MON_MSG_FLEE_IN_TERROR, true);
	}
}